

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Utility.cpp
# Opt level: O1

void amrex::SyncStrings(Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *localStrings,
                       Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *syncedStrings,bool *alreadySynced)

{
  *alreadySynced = true;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&syncedStrings->
               super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ,&localStrings->
                super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             );
  return;
}

Assistant:

void amrex::SyncStrings(const Vector<std::string> &localStrings,
                         Vector<std::string> &syncedStrings, bool &alreadySynced)
{
#ifdef BL_USE_MPI
  const int nProcs(ParallelDescriptor::NProcs());
  const int ioProcNumber(ParallelDescriptor::IOProcessorNumber());
  int nUnmatched(0);

  Vector<std::string> localStringsCopy = localStrings;

  // ---- broadcast ioproc strings
  int pfStringsSize(0);
  std::ostringstream pfStrings;
  if(ParallelDescriptor::IOProcessor()) {
    for(int i(0); i < localStringsCopy.size(); ++i) {
      pfStrings << localStringsCopy[i] << '\n';
    }
    pfStringsSize = pfStrings.str().size();
  }
  ParallelDescriptor::Bcast(&pfStringsSize, 1);

  Vector<char> pfCharArray(pfStringsSize + 1);
  if(ParallelDescriptor::IOProcessor()) {
    std::strcpy(pfCharArray.dataPtr(), pfStrings.str().c_str());  // null terminated
  }
  ParallelDescriptor::Bcast(pfCharArray.dataPtr(), pfCharArray.size());

  // ---- extract the ioproc strings
  Vector<std::string> ioprocStrings, sendStrings;
  if( ! ParallelDescriptor::IOProcessor()) {
    std::istringstream pfIn(pfCharArray.dataPtr());
    std::string pfName;
    while( ! pfIn.eof()) {
      std::getline(pfIn, pfName, '\n');
      if( ! pfIn.eof()) {
        ioprocStrings.push_back(pfName);
      }
    }
    // ---- now check if they match on non ioprocs
    for(int n(0); n < ioprocStrings.size(); ++n) {
      bool matched(false);
      for(int i(0); i < localStringsCopy.size(); ++i) {
        if(ioprocStrings[n] == localStringsCopy[i]) {
          matched = true;
        }
      }
      if( ! matched) {
        ++nUnmatched;
        localStringsCopy.push_back(ioprocStrings[n]);  // ---- add to local set
      }
    }
    for(int n(0); n < localStringsCopy.size(); ++n) {
      bool matched(false);
      for(int i(0); i < ioprocStrings.size(); ++i) {
        if(localStringsCopy[n] == ioprocStrings[i]) {
          matched = true;
        }
      }
      if( ! matched) {
        ++nUnmatched;
        sendStrings.push_back(localStringsCopy[n]);  // ---- send these to the ioproc
      }
    }
  }

  ParallelDescriptor::ReduceIntMax(nUnmatched);
  if(nUnmatched == 0) {
    alreadySynced = true;
    syncedStrings = localStrings;
    return;
  }
  alreadySynced = false;


  int sendStringsSize(0);
  std::ostringstream ossSendStrings;
  Vector<char> sendCharArray(1);  // cannot be zero for gather call
  if( ! ParallelDescriptor::IOProcessor()) {
    for(int i(0); i < sendStrings.size(); ++i) {
      ossSendStrings << sendStrings[i] << '\n';
    }
    sendStringsSize = ossSendStrings.str().size();
    sendCharArray.resize(sendStringsSize + 1);
    std::strcpy(sendCharArray.dataPtr(), ossSendStrings.str().c_str());  // null terminated
  }

  Vector<int> nChars(nProcs, 0);
  ParallelDescriptor::Gather(&sendStringsSize, 1, nChars.dataPtr(), 1, ioProcNumber);

  int totalChars(0);
  Vector<char> recvStrings(1);
  Vector<int> offset(nProcs, 0);
  if(ParallelDescriptor::IOProcessor()) {
    for(int i(0); i < nChars.size(); ++i) {
      totalChars += nChars[i];
    }
    recvStrings.resize(totalChars + 1);

    int iOffset(0);
    for(int i(1); i < nChars.size(); ++i) {
      iOffset += nChars[i-1];
      offset[i] = iOffset;
    }
  }

  BL_MPI_REQUIRE( MPI_Gatherv(sendCharArray.dataPtr(),
                              sendStringsSize,
                              ParallelDescriptor::Mpi_typemap<char>::type(),
                              recvStrings.dataPtr(),
                              nChars.dataPtr(),
                              offset.dataPtr(),
                              ParallelDescriptor::Mpi_typemap<char>::type(),
                              ioProcNumber,
                              ParallelDescriptor::Communicator()) );

  if(ParallelDescriptor::IOProcessor()) {
    std::istringstream pfIn(recvStrings.dataPtr());
    std::string pfName;
    syncedStrings = localStrings;
    while( ! pfIn.eof()) {
      std::getline(pfIn, pfName, '\n');
      if( ! pfIn.eof()) {
        syncedStrings.push_back(pfName);  // ---- add the gathered strings
      }
    }
  }

  // ---- broadcast synced ioproc strings
  int syncedStringsSize(0);
  std::ostringstream syncedStrStr;
  if(ParallelDescriptor::IOProcessor()) {
    for(int i(0); i < syncedStrings.size(); ++i) {
      syncedStrStr << syncedStrings[i] << '\n';
    }
    syncedStringsSize = syncedStrStr.str().size();
  }
  ParallelDescriptor::Bcast(&syncedStringsSize, 1);

  Vector<char> syncedCharArray(syncedStringsSize + 1);
  if(ParallelDescriptor::IOProcessor()) {
    std::strcpy(syncedCharArray.dataPtr(), syncedStrStr.str().c_str());  // null terminated
  }
  ParallelDescriptor::Bcast(syncedCharArray.dataPtr(), syncedCharArray.size());

  if( ! ParallelDescriptor::IOProcessor()) {
    std::istringstream syncedIn(syncedCharArray.dataPtr());
    std::string syncedName;
    while( ! syncedIn.eof()) {
      std::getline(syncedIn, syncedName, '\n');
      if( ! syncedIn.eof()) {
        syncedStrings.push_back(syncedName);
      }
    }
  }

#else
    alreadySynced = true;
    syncedStrings = localStrings;
#endif

}